

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O1

shared_ptr<LNode> __thiscall LParser::reduce_44(LParser *this)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  LNode *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  shared_ptr<LNode> sVar4;
  
  uVar1 = *(undefined8 *)(*(long *)(in_RSI + 0x38) + -0x30);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(in_RSI + 0x38) + -0x28);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  peVar2 = (element_type *)operator_new(0x30);
  (peVar2->token)._M_dataplus._M_p = (pointer)0x100000001;
  *(undefined ***)peVar2 = &PTR___Sp_counted_ptr_inplace_00122c20;
  *(undefined4 *)&(peVar2->token).field_2 = 0x34;
  (peVar2->token)._M_string_length = (size_type)&PTR__LNodeData_00122c70;
  *(undefined8 *)((long)&(peVar2->token).field_2 + 8) = 0;
  *(undefined8 *)(peVar2 + 1) = 0;
  *(undefined8 *)((long)&(peVar2->token).field_2 + 8) = uVar1;
  this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar2 + 1);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar2 + 1) = this_00;
  _Var3._M_pi = extraout_RDX;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var3._M_pi = extraout_RDX_00;
  }
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl = (LLexer *)&(peVar2->token)._M_string_length;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar4.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_44() {
    // RStmt : RETURN Vars BR Brs
    auto vars = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeRStmt>>(LNodeType::RStmt, LNodeRStmt(vars));
    return r;
}